

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O3

void __thiscall duckdb::GlobalSortState::PrepareMergePhase(GlobalSortState *this)

{
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  pointer pSVar4;
  idx_t iVar5;
  pointer pRVar6;
  pointer pSVar7;
  idx_t iVar8;
  ulong uVar9;
  pointer puVar10;
  iterator __end2;
  iterator __begin2;
  pointer puVar11;
  long lVar12;
  
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = 0;
  for (puVar11 = (this->sorted_blocks).
                 super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1; puVar11 = puVar11 + 1
      ) {
    pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(puVar11);
    iVar5 = SortedBlock::HeapSize(pSVar4);
    lVar12 = lVar12 + iVar5;
  }
  if (this->external == false) {
    bVar3 = 0;
    if ((this->pinned_blocks).
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->pinned_blocks).
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_012b397a;
    iVar5 = BufferManager::GetQueryMaxMemory(this->buffer_manager);
    if ((ulong)(lVar12 * 4) < iVar5 || lVar12 * 4 - iVar5 == 0) {
      bVar3 = this->external;
      goto LAB_012b397a;
    }
  }
  this->external = true;
  bVar3 = 1;
LAB_012b397a:
  puVar11 = (this->sorted_blocks).
            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((lVar12 == 0) || ((bVar3 & 1) == 0)) {
    if (puVar11 != puVar1) {
      iVar5 = this->block_capacity;
      do {
        pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(puVar11);
        puVar2 = (pSVar4->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar9 = 0;
        for (puVar10 = (pSVar4->radix_sorting_data).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
            puVar10 = puVar10 + 1) {
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(puVar10);
          uVar9 = uVar9 + pRVar6->count;
        }
        if (iVar5 <= uVar9) {
          iVar5 = uVar9;
        }
        this->block_capacity = iVar5;
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar1);
    }
  }
  else if (puVar11 != puVar1) {
    uVar9 = 0;
    do {
      pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      iVar5 = SortedBlock::SizeInBytes(pSVar4);
      if (uVar9 < iVar5) {
        pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(puVar11);
        puVar2 = (pSVar4->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar8 = 0;
        for (puVar10 = (pSVar4->radix_sorting_data).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
            puVar10 = puVar10 + 1) {
          pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                   ::operator->(puVar10);
          iVar8 = iVar8 + pRVar6->count;
        }
        this->block_capacity = iVar8;
        uVar9 = iVar5;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar1);
  }
  if (this->external == false) {
    puVar1 = (this->sorted_blocks).
             super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->sorted_blocks).
                   super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1;
        puVar11 = puVar11 + 1) {
      pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      pSVar7 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar4->blob_sorting_data);
      SortedData::Unswizzle(pSVar7);
      pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar11);
      pSVar7 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar4->payload_data);
      SortedData::Unswizzle(pSVar7);
    }
  }
  return;
}

Assistant:

void GlobalSortState::PrepareMergePhase() {
	// Determine if we need to use do an external sort
	idx_t total_heap_size =
	    std::accumulate(sorted_blocks.begin(), sorted_blocks.end(), (idx_t)0,
	                    [](idx_t a, const unique_ptr<SortedBlock> &b) { return a + b->HeapSize(); });
	if (external || (pinned_blocks.empty() && total_heap_size * 4 > buffer_manager.GetQueryMaxMemory())) {
		external = true;
	}
	// Use the data that we have to determine which partition size to use during the merge
	if (external && total_heap_size > 0) {
		// If we have variable size data we need to be conservative, as there might be skew
		idx_t max_block_size = 0;
		for (auto &sb : sorted_blocks) {
			idx_t size_in_bytes = sb->SizeInBytes();
			if (size_in_bytes > max_block_size) {
				max_block_size = size_in_bytes;
				block_capacity = sb->Count();
			}
		}
	} else {
		for (auto &sb : sorted_blocks) {
			block_capacity = MaxValue(block_capacity, sb->Count());
		}
	}
	// Unswizzle and pin heap blocks if we can fit everything in memory
	if (!external) {
		for (auto &sb : sorted_blocks) {
			sb->blob_sorting_data->Unswizzle();
			sb->payload_data->Unswizzle();
		}
	}
}